

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c-writer.cc
# Opt level: O1

void __thiscall
wabt::(anonymous_namespace)::CWriter::
Write<wabt::(anonymous_namespace)::StackVar,char_const(&)[28],wabt::(anonymous_namespace)::StackVar,char_const(&)[3],unsigned_long_const&,char_const(&)[3],wabt::(anonymous_namespace)::StackVar,char_const(&)[3],wabt::(anonymous_namespace)::Newline>
          (CWriter *this,StackVar *t,char (*u) [28],StackVar *args,char (*args_1) [3],
          unsigned_long *args_2,char (*args_3) [3],StackVar *args_4,char (*args_5) [3],
          Newline *args_6)

{
  size_t size;
  StackVar *args_00;
  char (*u_00) [3];
  
  args_00 = args;
  anon_unknown_0::CWriter::Write((CWriter *)this,t);
  size = strlen(*u);
  anon_unknown_0::CWriter::WriteData((CWriter *)this,*u,size);
  anon_unknown_0::CWriter::Write((CWriter *)this,args);
  anon_unknown_0::CWriter::WriteData((CWriter *)this,", ",2);
  anon_unknown_0::CWriter::Writef((CWriter *)this,"%lu",*(undefined8 *)args_1);
  anon_unknown_0::CWriter::WriteData((CWriter *)this,", ",2);
  Write<wabt::(anonymous_namespace)::StackVar,char_const(&)[3],wabt::(anonymous_namespace)::Newline>
            (this,(StackVar *)args_2,u_00,(Newline *)args_00);
  return;
}

Assistant:

void Write(T&& t, U&& u, Args&&... args) {
    Write(std::forward<T>(t));
    Write(std::forward<U>(u));
    Write(std::forward<Args>(args)...);
  }